

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O3

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  FileReaderCtx ctx;
  FILE *local_2038 [1025];
  
  if (filename == (char *)0x0) {
    local_2038[0] = _stdin;
    pcVar4 = "=stdin";
  }
  else {
    local_2038[0] = fopen64(filename,"rb");
    if (local_2038[0] == (FILE *)0x0) {
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      lua_pushfstring(L,"cannot open %s: %s",filename,pcVar4);
      return 6;
    }
    pcVar4 = lua_pushfstring(L,"@%s",filename);
  }
  iVar2 = lua_loadx(L,reader_file,local_2038,pcVar4,mode);
  iVar3 = ferror(local_2038[0]);
  if (iVar3 == 0) {
    if (filename == (char *)0x0) {
      return iVar2;
    }
    pTVar1 = L->top;
    L->top = pTVar1 + -1;
    pTVar1[-2] = pTVar1[-1];
  }
  else {
    L->top = (TValue *)((long)L->top + ((ulong)(filename == (char *)0x0) << 3 | 0xfffffffffffffff0))
    ;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    lua_pushfstring(L,"cannot read %s: %s",pcVar4 + 1,pcVar6);
    iVar2 = 6;
    if (filename == (char *)0x0) {
      return 6;
    }
  }
  fclose(local_2038[0]);
  return iVar2;
}

Assistant:

LUALIB_API int luaL_loadfilex(lua_State *L, const char *filename,
			      const char *mode)
{
  FileReaderCtx ctx;
  int status;
  const char *chunkname;
  if (filename) {
    ctx.fp = fopen(filename, "rb");
    if (ctx.fp == NULL) {
      lua_pushfstring(L, "cannot open %s: %s", filename, strerror(errno));
      return LUA_ERRFILE;
    }
    chunkname = lua_pushfstring(L, "@%s", filename);
  } else {
    ctx.fp = stdin;
    chunkname = "=stdin";
  }
  status = lua_loadx(L, reader_file, &ctx, chunkname, mode);
  if (ferror(ctx.fp)) {
    L->top -= filename ? 2 : 1;
    lua_pushfstring(L, "cannot read %s: %s", chunkname+1, strerror(errno));
    if (filename)
      fclose(ctx.fp);
    return LUA_ERRFILE;
  }
  if (filename) {
    L->top--;
    copyTV(L, L->top-1, L->top);
    fclose(ctx.fp);
  }
  return status;
}